

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O1

void __thiscall
github111116::ConsoleLogger::print<std::__cxx11::string>
          (ConsoleLogger *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  char cVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (this->out,(t->_M_dataplus)._M_p,t->_M_string_length);
  cVar1 = (char)this->out;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}